

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

exr_result_t
LossyDctEncoder_construct
          (LossyDctEncoder *e,float quantBaseError,DctCoderChannelData *rowPtrs,uint8_t *packedAc,
          uint8_t *packedDc,uint16_t *toNonlinear,int width,int height)

{
  exr_result_t eVar1;
  undefined8 in_RSI;
  long in_RDI;
  exr_result_t rv;
  int in_stack_000001e8;
  int in_stack_000001ec;
  uint16_t *in_stack_000001f0;
  uint8_t *in_stack_000001f8;
  uint8_t *in_stack_00000200;
  float in_stack_0000020c;
  LossyDctEncoder *in_stack_00000210;
  
  eVar1 = LossyDctEncoder_base_construct
                    (in_stack_00000210,in_stack_0000020c,in_stack_00000200,in_stack_000001f8,
                     in_stack_000001f0,in_stack_000001ec,in_stack_000001e8);
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  *(undefined4 *)(in_RDI + 0x30) = 1;
  return eVar1;
}

Assistant:

exr_result_t
LossyDctEncoder_construct (
    LossyDctEncoder*     e,
    float                quantBaseError,
    DctCoderChannelData* rowPtrs,
    uint8_t*             packedAc,
    uint8_t*             packedDc,
    const uint16_t*      toNonlinear,
    int                  width,
    int                  height)
{
    exr_result_t rv;

    rv = LossyDctEncoder_base_construct (
        e, quantBaseError, packedAc, packedDc, toNonlinear, width, height);
    e->_channel_encode_data[0]    = rowPtrs;
    e->_channel_encode_data_count = 1;

    return rv;
}